

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp,stbi__result_info *ri)

{
  int iVar1;
  stbi_uc *psVar2;
  int local_58;
  uint local_54;
  int internal_comp;
  int y;
  int x;
  int i;
  stbi_uc *result;
  stbi__result_info *ri_local;
  int *piStack_30;
  int req_comp_local;
  int *comp_local;
  int *py_local;
  int *px_local;
  stbi__context *s_local;
  
  piStack_30 = comp;
  if (comp == (int *)0x0) {
    piStack_30 = &local_58;
  }
  result = (stbi_uc *)ri;
  ri_local._4_4_ = req_comp;
  comp_local = py;
  py_local = px;
  px_local = (int *)s;
  for (y = 0; y < 0x5c; y = y + 1) {
    stbi__get8((stbi__context *)px_local);
  }
  internal_comp = stbi__get16be((stbi__context *)px_local);
  local_54 = stbi__get16be((stbi__context *)px_local);
  iVar1 = stbi__at_eof((stbi__context *)px_local);
  if (iVar1 == 0) {
    iVar1 = stbi__mad3sizes_valid(internal_comp,local_54,4,0);
    if (iVar1 == 0) {
      stbi__err("too large");
      s_local = (stbi__context *)0x0;
    }
    else {
      stbi__get32be((stbi__context *)px_local);
      stbi__get16be((stbi__context *)px_local);
      stbi__get16be((stbi__context *)px_local);
      _x = (stbi_uc *)stbi__malloc_mad3(internal_comp,local_54,4,0);
      memset(_x,0xff,(long)(int)(internal_comp * local_54 * 4));
      psVar2 = stbi__pic_load_core((stbi__context *)px_local,internal_comp,local_54,piStack_30,_x);
      if (psVar2 == (stbi_uc *)0x0) {
        free(_x);
        _x = (uchar *)0x0;
      }
      *py_local = internal_comp;
      *comp_local = local_54;
      if (ri_local._4_4_ == 0) {
        ri_local._4_4_ = *piStack_30;
      }
      s_local = (stbi__context *)stbi__convert_format(_x,4,ri_local._4_4_,internal_comp,local_54);
    }
  }
  else {
    stbi__err("bad file");
    s_local = (stbi__context *)0x0;
  }
  return s_local;
}

Assistant:

static void *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp, stbi__result_info *ri)
{
   stbi_uc *result;
   int i, x,y, internal_comp;
   STBI_NOTUSED(ri);

   if (!comp) comp = &internal_comp;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);
   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if (!stbi__mad3sizes_valid(x, y, 4, 0)) return stbi__errpuc("too large", "PIC image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc_mad3(x, y, 4, 0);
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}